

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<TPZFlopCounter>::AddKel
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *elmat,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  TPZFlopCounter prevval;
  double local_48;
  TPZVec<long> *local_40;
  long local_38;
  
  lVar6 = (elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
  local_40 = destinationindex;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_38 = lVar6;
  if (iVar4 == 0) {
    if (0 < lVar6) {
      lVar6 = 0;
      do {
        lVar1 = local_40->fStore[lVar6];
        lVar5 = 0;
        do {
          lVar2 = local_40->fStore[lVar5];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar1,lVar2);
          lVar3 = (elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
          if ((lVar3 <= lVar6) ||
             ((elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar5)) {
            TPZFMatrix<TPZFlopCounter>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_48 = extraout_XMM0_Qa_00 + elmat->fElem[lVar3 * lVar5 + lVar6].fVal;
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar1,lVar2,&local_48);
          lVar5 = lVar5 + 1;
        } while (local_38 != lVar5);
        lVar6 = lVar6 + 1;
      } while (lVar6 != local_38);
    }
  }
  else if (0 < lVar6) {
    lVar6 = 0;
    do {
      lVar1 = local_40->fStore[lVar6];
      lVar5 = lVar6;
      do {
        lVar2 = local_40->fStore[lVar5];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar1,lVar2);
        lVar3 = (elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
        if ((lVar3 <= lVar6) ||
           ((elmat->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<TPZFlopCounter>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_48 = extraout_XMM0_Qa + elmat->fElem[lVar3 * lVar5 + lVar6].fVal;
        TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar1,lVar2,&local_48);
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_38);
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_38);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}